

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool cmFortranParser_FilePush(cmFortranParser *parser,char *fname)

{
  FILE *file;
  YY_BUFFER_STATE pyVar1;
  cmFortranFile f;
  string dir;
  allocator local_79;
  undefined1 local_78 [56];
  string local_40;
  
  std::__cxx11::string::string((string *)local_78,fname,(allocator *)&local_40);
  file = cmsys::SystemTools::Fopen((string *)local_78,"rb");
  std::__cxx11::string::~string((string *)local_78);
  if (file != (FILE *)0x0) {
    pyVar1 = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::__cxx11::string::string((string *)local_78,fname,&local_79);
    cmsys::SystemTools::GetParentDirectory(&local_40,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    cmFortranFile::cmFortranFile((cmFortranFile *)local_78,file,pyVar1,&local_40);
    pyVar1 = cmFortran_yy_create_buffer((FILE *)0x0,0x4000,parser->Scanner);
    cmFortran_yy_switch_to_buffer(pyVar1,parser->Scanner);
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::push_back
              (&(parser->FileStack).c,(value_type *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    std::__cxx11::string::~string((string *)&local_40);
  }
  return file != (FILE *)0x0;
}

Assistant:

bool cmFortranParser_FilePush(cmFortranParser* parser, const char* fname)
{
  // Open the new file and push it onto the stack.  Save the old
  // buffer with it on the stack.
  if (FILE* file = cmsys::SystemTools::Fopen(fname, "rb")) {
    YY_BUFFER_STATE current = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::string dir = cmSystemTools::GetParentDirectory(fname);
    cmFortranFile f(file, current, dir);
    YY_BUFFER_STATE buffer =
      cmFortran_yy_create_buffer(CM_NULLPTR, 16384, parser->Scanner);
    cmFortran_yy_switch_to_buffer(buffer, parser->Scanner);
    parser->FileStack.push(f);
    return true;
  }
  return false;
}